

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O1

void Hop_ManCleanData(Hop_Man_t *p)

{
  long lVar1;
  Vec_Ptr_t *pVVar2;
  
  p->nTravIds = 1;
  (p->pConst1->field_0).pData = (void *)0x0;
  pVVar2 = p->vPis;
  if (0 < pVVar2->nSize) {
    lVar1 = 0;
    do {
      *(undefined8 *)pVVar2->pArray[lVar1] = 0;
      lVar1 = lVar1 + 1;
      pVVar2 = p->vPis;
    } while (lVar1 < pVVar2->nSize);
  }
  pVVar2 = p->vPos;
  if (0 < pVVar2->nSize) {
    lVar1 = 0;
    do {
      *(undefined8 *)pVVar2->pArray[lVar1] = 0;
      lVar1 = lVar1 + 1;
      pVVar2 = p->vPos;
    } while (lVar1 < pVVar2->nSize);
  }
  if (0 < p->nTableSize) {
    lVar1 = 0;
    do {
      if (p->pTable[lVar1] != (Hop_Obj_t *)0x0) {
        (p->pTable[lVar1]->field_0).pData = (void *)0x0;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nTableSize);
  }
  return;
}

Assistant:

void Hop_ManCleanData( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    int i;
    p->nTravIds = 1;
    Hop_ManConst1(p)->pData = NULL;
    Hop_ManForEachPi( p, pObj, i )
        pObj->pData = NULL;
    Hop_ManForEachPo( p, pObj, i )
        pObj->pData = NULL;
    Hop_ManForEachNode( p, pObj, i )
        pObj->pData = NULL;
}